

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

string_view __thiscall
wabt::anon_unknown_0::StripLeadingDollar(anon_unknown_0 *this,string_view name)

{
  string_view sVar1;
  bool bVar2;
  const_reference pvVar3;
  undefined1 auStack_28 [8];
  string_view name_local;
  
  name_local._M_len = name._M_len;
  auStack_28 = (undefined1  [8])this;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!name.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                  ,0x2fb,
                  "std::string_view wabt::(anonymous namespace)::StripLeadingDollar(std::string_view)"
                 );
  }
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::front
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
  if (*pvVar3 == '$') {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,1);
    sVar1._M_str = (char *)name_local._M_len;
    sVar1._M_len = (size_t)auStack_28;
    return sVar1;
  }
  __assert_fail("name.front() == \'$\'",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/c-writer.cc"
                ,0x2fc,
                "std::string_view wabt::(anonymous namespace)::StripLeadingDollar(std::string_view)"
               );
}

Assistant:

std::string_view StripLeadingDollar(std::string_view name) {
  assert(!name.empty());
  assert(name.front() == '$');
  name.remove_prefix(1);
  return name;
}